

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_string_length(lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
                       lyxp_set *set,int options)

{
  ly_ctx *plVar1;
  int iVar2;
  lys_node *plVar3;
  char *pcVar4;
  size_t sVar5;
  uint local_4c;
  int ret;
  lys_node_leaf *sleaf;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t arg_count_local;
  lyxp_set **args_local;
  
  local_4c = 0;
  if ((options & 0x1cU) == 0) {
    if (arg_count == 0) {
      iVar2 = lyxp_set_cast(set,LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar2 != 0) {
        return -1;
      }
      sVar5 = strlen((set->val).str);
      set_fill_number(set,(longdouble)*(float *)(&DAT_00206a88 + (ulong)((long)sVar5 < 0) * 4) +
                          (longdouble)(long)sVar5);
    }
    else {
      iVar2 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar2 != 0) {
        return -1;
      }
      sVar5 = strlen(((*args)->val).str);
      set_fill_number(set,(longdouble)*(float *)(&DAT_00206a88 + (ulong)((long)sVar5 < 0) * 4) +
                          (longdouble)(long)sVar5);
    }
    args_local._4_4_ = 0;
  }
  else {
    if (((arg_count != 0) && ((*args)->type == LYXP_SET_SNODE_SET)) &&
       (plVar3 = warn_get_snode_in_ctx(*args), plVar3 != (lys_node *)0x0)) {
      if ((plVar3->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar1 = param_4->ctx;
        pcVar4 = strnodetype(plVar3->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".",
               "xpath_string_length",pcVar4,plVar3->name);
        local_4c = 1;
      }
      else {
        iVar2 = warn_is_string_type((lys_type *)&plVar3[1].ref);
        if (iVar2 == 0) {
          ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of string-type.","xpath_string_length",
                 plVar3->name);
        }
        local_4c = (uint)(iVar2 == 0);
      }
    }
    if (((arg_count == 0) && (set->type == LYXP_SET_SNODE_SET)) &&
       (plVar3 = warn_get_snode_in_ctx(set), plVar3 != (lys_node *)0x0)) {
      if ((plVar3->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar1 = param_4->ctx;
        pcVar4 = strnodetype(plVar3->nodetype);
        ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #0 of %s is a %s node \"%s\".",
               "xpath_string_length",pcVar4,plVar3->name);
        local_4c = 1;
      }
      else {
        iVar2 = warn_is_string_type((lys_type *)&plVar3[1].ref);
        if (iVar2 == 0) {
          ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #0 of %s is node \"%s\", not of string-type.","xpath_string_length",
                 plVar3->name);
          local_4c = 1;
        }
      }
    }
    set_snode_clear_ctx(set);
    args_local._4_4_ = local_4c;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_string_length(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                    struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        if (!arg_count && (set->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(set))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #0 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #0 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (arg_count) {
        if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        set_fill_number(set, strlen(args[0]->val.str));
    } else {
        if (lyxp_set_cast(set, LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        set_fill_number(set, strlen(set->val.str));
    }

    return EXIT_SUCCESS;
}